

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordString *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  __type _Var1;
  bool bVar2;
  string *psVar3;
  string line;
  string local_90;
  string local_70;
  string local_50;
  
  psVar3 = &(option->super_OptionRecord).name;
  _Var1 = std::operator==(psVar3,&kOptionsFileString_abi_cxx11_);
  if (!_Var1) {
    if ((report_only_deviations) &&
       (bVar2 = std::operator!=(&option->default_value,option->value), !bVar2)) {
      return;
    }
    if (file_type == kFull) {
      fprintf((FILE *)file,"\n# %s\n",(option->super_OptionRecord).description._M_dataplus._M_p);
      highsBoolToString_abi_cxx11_(&line,(option->super_OptionRecord).advanced,2);
      fprintf((FILE *)file,"# [type: string, advanced: %s, default: \"%s\"]\n",line._M_dataplus._M_p
              ,(option->default_value)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&line);
      fprintf((FILE *)file,"%s = %s\n",(option->super_OptionRecord).name._M_dataplus._M_p,
              (option->value->_M_dataplus)._M_p);
    }
    else {
      if (file_type == kMd) {
        std::__cxx11::string::string((string *)&local_70,(string *)psVar3);
        highsInsertMdEscapes(&line,&local_70);
        std::__cxx11::string::string
                  ((string *)&local_90,(string *)&(option->super_OptionRecord).description);
        highsInsertMdEscapes(&local_50,&local_90);
        fprintf((FILE *)file,"## %s\n- %s\n- Type: string\n- Default: \"%s\"\n\n",
                line._M_dataplus._M_p,local_50._M_dataplus._M_p,
                (option->default_value)._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&line);
        psVar3 = &local_70;
      }
      else {
        highsFormatToString_abi_cxx11_
                  (&line,"Set option %s to \"%s\"\n",
                   (option->super_OptionRecord).name._M_dataplus._M_p,
                   (option->value->_M_dataplus)._M_p);
        if (_stdout == file) {
          highsLogUser(log_options,kInfo,"%s");
        }
        else {
          fputs(line._M_dataplus._M_p,(FILE *)file);
        }
        psVar3 = &line;
      }
      std::__cxx11::string::~string((string *)psVar3);
    }
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordString& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  // Don't report for the options file if writing to an options file
  // Don't report options that can only be passed via the command line
  if (option.name == kOptionsFileString) return;
  // ToDo: are there others?

  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(file, "## %s\n- %s\n- Type: string\n- Default: \"%s\"\n\n",
              highsInsertMdEscapes(option.name).c_str(),
              highsInsertMdEscapes(option.description).c_str(),
              option.default_value.c_str());
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file, "# [type: string, advanced: %s, default: \"%s\"]\n",
              highsBoolToString(option.advanced).c_str(),
              option.default_value.c_str());
      fprintf(file, "%s = %s\n", option.name.c_str(), (*option.value).c_str());
    } else {
      std::string line =
          highsFormatToString("Set option %s to \"%s\"\n", option.name.c_str(),
                              (*option.value).c_str());
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}